

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat4 * dja::adjugate(mat4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  mat4 *in_RDI;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  fVar1 = m->m[0].y;
  fVar2 = m->m[0].z;
  fVar3 = m->m[0].w;
  fVar4 = m->m[2].y;
  fVar5 = m->m[2].w;
  fVar6 = m->m[1].z;
  fVar7 = m->m[3].z;
  fVar8 = m->m[2].z;
  fVar9 = m->m[1].w;
  fVar10 = m->m[3].w;
  fVar19 = fVar8 * fVar10 - fVar5 * fVar7;
  fVar20 = fVar2 * fVar9 - fVar3 * fVar6;
  fVar11 = m->m[1].y;
  fVar12 = m->m[3].y;
  fVar25 = fVar4 * fVar10 - fVar5 * fVar12;
  fVar26 = fVar1 * fVar9 - fVar3 * fVar11;
  fVar13 = m->m[3].x;
  fVar14 = m->m[1].x;
  fVar17 = fVar4 * fVar7 - fVar8 * fVar12;
  fVar18 = fVar1 * fVar6 - fVar2 * fVar11;
  fVar15 = m->m[0].x;
  fVar16 = m->m[2].x;
  in_RDI->m[0].x = fVar9 * fVar17 + fVar11 * fVar19 + -fVar6 * fVar25;
  in_RDI->m[0].y = -fVar3 * fVar17 + -fVar1 * fVar19 + fVar2 * fVar25;
  in_RDI->m[0].z = fVar10 * fVar18 + fVar12 * fVar20 + -fVar7 * fVar26;
  in_RDI->m[0].w = -fVar5 * fVar18 + -fVar4 * fVar20 + fVar8 * fVar26;
  fVar23 = fVar10 * fVar16 - fVar5 * fVar13;
  fVar24 = fVar9 * fVar15 - fVar3 * fVar14;
  fVar21 = fVar16 * fVar7 - fVar8 * fVar13;
  fVar22 = fVar15 * fVar6 - fVar2 * fVar14;
  in_RDI->m[1].x = -fVar9 * fVar21 + -fVar14 * fVar19 + fVar6 * fVar23;
  in_RDI->m[1].y = fVar3 * fVar21 + fVar15 * fVar19 + -fVar2 * fVar23;
  in_RDI->m[1].z = -fVar10 * fVar22 + -fVar13 * fVar20 + fVar7 * fVar24;
  in_RDI->m[1].w = fVar5 * fVar22 + fVar16 * fVar20 + -fVar8 * fVar24;
  fVar19 = fVar16 * fVar12 - fVar13 * fVar4;
  fVar20 = fVar15 * fVar11 - fVar14 * fVar1;
  in_RDI->m[2].x = fVar9 * fVar19 + fVar25 * fVar14 + -fVar11 * fVar23;
  in_RDI->m[2].y = -fVar3 * fVar19 + fVar25 * -fVar15 + fVar23 * fVar1;
  in_RDI->m[2].z = fVar10 * fVar20 + fVar26 * fVar13 + fVar24 * -fVar12;
  in_RDI->m[2].w = -fVar5 * fVar20 + fVar26 * -fVar16 + fVar4 * fVar24;
  in_RDI->m[3].x = fVar19 * -fVar6 + fVar17 * -fVar14 + fVar21 * fVar11;
  in_RDI->m[3].y = fVar2 * fVar19 + fVar15 * fVar17 + fVar21 * -fVar1;
  in_RDI->m[3].z = -fVar7 * fVar20 + -fVar13 * fVar18 + fVar22 * fVar12;
  in_RDI->m[3].w = fVar20 * fVar8 + fVar18 * fVar16 + fVar22 * -fVar4;
  return in_RDI;
}

Assistant:

mat4 adjugate(const mat4& m)
{
    /* based on Laplace expansion theorem */
    const float_t s0 = M00(m) * M11(m) - M10(m) * M01(m);
    const float_t s1 = M00(m) * M12(m) - M10(m) * M02(m);
    const float_t s2 = M00(m) * M13(m) - M10(m) * M03(m);
    const float_t s3 = M01(m) * M12(m) - M11(m) * M02(m);
    const float_t s4 = M01(m) * M13(m) - M11(m) * M03(m);
    const float_t s5 = M02(m) * M13(m) - M12(m) * M03(m);
    const float_t c5 = M22(m) * M33(m) - M32(m) * M23(m);
    const float_t c4 = M21(m) * M33(m) - M31(m) * M23(m);
    const float_t c3 = M21(m) * M32(m) - M31(m) * M22(m);
    const float_t c2 = M20(m) * M33(m) - M30(m) * M23(m);
    const float_t c1 = M20(m) * M32(m) - M30(m) * M22(m);
    const float_t c0 = M20(m) * M31(m) - M30(m) * M21(m);
    mat4 a;

    M00(a) = M11(m)*c5 - M12(m)*c4 + M13(m)*c3;
    M01(a) =-M01(m)*c5 + M02(m)*c4 - M03(m)*c3;
    M02(a) = M31(m)*s5 - M32(m)*s4 + M33(m)*s3;
    M03(a) =-M21(m)*s5 + M22(m)*s4 - M23(m)*s3;

    M10(a) =-M10(m)*c5 + M12(m)*c2 - M13(m)*c1;
    M11(a) = M00(m)*c5 - M02(m)*c2 + M03(m)*c1;
    M12(a) =-M30(m)*s5 + M32(m)*s2 - M33(m)*s1;
    M13(a) = M20(m)*s5 - M22(m)*s2 + M23(m)*s1;

    M20(a) = M10(m)*c4 - M11(m)*c2 + M13(m)*c0;
    M21(a) =-M00(m)*c4 + M01(m)*c2 - M03(m)*c0;
    M22(a) = M30(m)*s4 - M31(m)*s2 + M33(m)*s0;
    M23(a) =-M20(m)*s4 + M21(m)*s2 - M23(m)*s0;

    M30(a) =-M10(m)*c3 + M11(m)*c1 - M12(m)*c0;
    M31(a) = M00(m)*c3 - M01(m)*c1 + M02(m)*c0;
    M32(a) =-M30(m)*s3 + M31(m)*s1 - M32(m)*s0;
    M33(a) = M20(m)*s3 - M21(m)*s1 + M22(m)*s0;

    return a;
}